

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_fprint(NJDNode *node,FILE *fp)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  pcVar2 = node->string;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "*";
  }
  pcVar1 = node->pos;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "*";
  }
  pcVar5 = node->pos_group1;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "*";
  }
  pcVar6 = node->pos_group2;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "*";
  }
  pcVar4 = node->pos_group3;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "*";
  }
  pcVar8 = node->ctype;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "*";
  }
  pcVar3 = node->cform;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "*";
  }
  pcVar11 = node->orig;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "*";
  }
  pcVar9 = node->read;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "*";
  }
  pcVar10 = node->pron;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "*";
  }
  pcVar7 = node->chain_rule;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "*";
  }
  fprintf((FILE *)fp,"%s,%s,%s,%s,%s,%s,%s,%s,%s,%s,%d/%d,%s,%d\n",pcVar2,pcVar1,pcVar5,pcVar6,
          pcVar4,pcVar8,pcVar3,pcVar11,pcVar9,pcVar10,(ulong)(uint)node->acc,
          (ulong)(uint)node->mora_size,pcVar7,(ulong)(uint)node->chain_flag);
  return;
}

Assistant:

void NJDNode_fprint(NJDNode * node, FILE * fp)
{
   fprintf(fp, "%s,%s,%s,%s,%s,%s,%s,%s,%s,%s,%d/%d,%s,%d\n", NJDNode_get_string(node),
           NJDNode_get_pos(node), NJDNode_get_pos_group1(node), NJDNode_get_pos_group2(node),
           NJDNode_get_pos_group3(node), NJDNode_get_ctype(node), NJDNode_get_cform(node),
           NJDNode_get_orig(node), NJDNode_get_read(node), NJDNode_get_pron(node),
           NJDNode_get_acc(node), NJDNode_get_mora_size(node), NJDNode_get_chain_rule(node),
           NJDNode_get_chain_flag(node));
}